

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIndexingTests.cpp
# Opt level: O1

int __thiscall deqp::ShaderIndexingTests::init(ShaderIndexingTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  GLSLVersion GVar2;
  Context *pCVar3;
  int iVar4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  int iVar7;
  int iVar8;
  int vecSize;
  DataType dataType;
  TestNode *pTVar9;
  char *pcVar10;
  long *plVar11;
  size_t sVar12;
  ShaderIndexingCase *pSVar13;
  ostringstream *poVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  char *pcVar19;
  long *plVar20;
  size_type *psVar21;
  _func_int **pp_Var22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  char *pcVar26;
  long lVar27;
  ShaderEvalFunc p_Var28;
  long lVar29;
  uint uVar30;
  long lVar31;
  ostringstream *poVar32;
  undefined1 *puVar33;
  StringTemplate vertTemplate;
  _Alloc_hider local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  string vertexShaderSource;
  allocator<char> local_461;
  StringTemplate fragTemplate;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  int local_410;
  ulong local_408;
  string local_400;
  Context *local_3e0;
  string desc;
  string name;
  ulong local_348;
  long local_340;
  ostringstream vtx;
  ostringstream frag;
  
  pTVar9 = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,pCVar3->m_testCtx,"varying_array","Varying array access tests."
            );
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_0210f0c8;
  pTVar9[1]._vptr_TestNode = (_func_int **)pCVar3;
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  lVar24 = 0;
  do {
    DVar1 = deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[lVar24];
    uVar23 = 0;
    do {
      lVar25 = 0x1d;
      if (uVar23 == 1) {
        lVar25 = 0x37;
      }
      pcVar26 = "uniform mediump int ui_four;\n";
      if (uVar23 == 1) {
        pcVar26 = "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
      }
      lVar18 = 0x26;
      if (uVar23 == 2) {
        lVar18 = 0x20;
      }
      pcVar19 = "    for (int i = 0; i < ui_four; i++)\n";
      if (uVar23 == 2) {
        pcVar19 = "    for (int i = 0; i < 4; i++)\n";
      }
      lVar29 = 0;
      do {
        local_410 = (int)uVar23;
        if ((int)lVar29 != 0 || local_410 != 0) {
          pcVar10 = glu::getDataTypeName(DVar1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fragTemplate,pcVar10,(allocator<char> *)&vertexShaderSource);
          plVar11 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
          params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          plVar20 = plVar11 + 2;
          if ((long *)*plVar11 == plVar20) {
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar20;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar11[3];
          }
          else {
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar20;
            params._M_t._M_impl._0_8_ = (long *)*plVar11;
          }
          params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar11[1];
          *plVar11 = (long)plVar20;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&params);
          vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
          psVar21 = (size_type *)(plVar11 + 2);
          if ((size_type *)*plVar11 == psVar21) {
            vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
            vertTemplate.m_template.field_2._8_8_ = plVar11[3];
          }
          else {
            vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
            vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
          }
          vertTemplate.m_template._M_string_length = plVar11[1];
          *plVar11 = (long)psVar21;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
          frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
          pp_Var22 = (_func_int **)(plVar11 + 2);
          if ((_func_int **)*plVar11 == pp_Var22) {
            frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
            frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
          }
          else {
            frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
            frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)*plVar11;
          }
          frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
          *plVar11 = (long)pp_Var22;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
          vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
          pp_Var22 = (_func_int **)(plVar11 + 2);
          if ((_func_int **)*plVar11 == pp_Var22) {
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
          }
          else {
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)*plVar11;
          }
          vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
          *plVar11 = (long)pp_Var22;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar21 = (size_type *)(plVar11 + 2);
          if ((size_type *)*plVar11 == psVar21) {
            name.field_2._M_allocated_capacity = *psVar21;
            name.field_2._8_8_ = plVar11[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar21;
            name._M_dataplus._M_p = (pointer)*plVar11;
          }
          name._M_string_length = plVar11[1];
          *plVar11 = (long)psVar21;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
              (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
            operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream,
                            vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
          }
          if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
              (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
            operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream,
                            frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
            operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                            vertTemplate.m_template.field_2._M_allocated_capacity + 1);
          }
          if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
              &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)params._M_t._M_impl._0_8_,
                            (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                           _M_parent)->_M_color + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
            operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                            fragTemplate.m_template.field_2._M_allocated_capacity + 1);
          }
          params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&params,"Varying array with ","");
          plVar11 = (long *)std::__cxx11::string::append((char *)&params);
          vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
          psVar21 = (size_type *)(plVar11 + 2);
          if ((size_type *)*plVar11 == psVar21) {
            vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
            vertTemplate.m_template.field_2._8_8_ = plVar11[3];
          }
          else {
            vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
            vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
          }
          vertTemplate.m_template._M_string_length = plVar11[1];
          *plVar11 = (long)psVar21;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
          frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
          pp_Var22 = (_func_int **)(plVar11 + 2);
          if ((_func_int **)*plVar11 == pp_Var22) {
            frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
            frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
          }
          else {
            frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
            frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)*plVar11;
          }
          frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
          *plVar11 = (long)pp_Var22;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
          vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
          pp_Var22 = (_func_int **)(plVar11 + 2);
          if ((_func_int **)*plVar11 == pp_Var22) {
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
          }
          else {
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)*plVar11;
          }
          vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
          *plVar11 = (long)pp_Var22;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
          desc._M_dataplus._M_p = (pointer)&desc.field_2;
          psVar21 = (size_type *)(plVar11 + 2);
          if ((size_type *)*plVar11 == psVar21) {
            desc.field_2._M_allocated_capacity = *psVar21;
            desc.field_2._8_8_ = plVar11[3];
          }
          else {
            desc.field_2._M_allocated_capacity = *psVar21;
            desc._M_dataplus._M_p = (pointer)*plVar11;
          }
          desc._M_string_length = plVar11[1];
          *plVar11 = (long)psVar21;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
              (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
            operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream,
                            vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
          }
          if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
              (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
            operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream,
                            frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
            operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                            vertTemplate.m_template.field_2._M_allocated_capacity + 1);
          }
          if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
              &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)params._M_t._M_impl._0_8_,
                            (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                           _M_parent)->_M_color + 1));
          }
          _Var6._M_p = name._M_dataplus._M_p;
          _Var5._M_p = desc._M_dataplus._M_p;
          local_3e0 = (this->super_TestCaseGroup).m_context;
          GVar2 = this->m_glslVersion;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
          pcVar10 = glu::getGLSLVersionDeclaration(GVar2);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)&vertTemplate +
                            (int)vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream[-3] + 0x1a8);
          }
          else {
            sVar12 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10,sVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "in highp vec4 a_position;\n",0x1a);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "in highp vec4 a_coords;\n",0x18);
          if ((uVar23 | 2) == 3) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar26,lVar25);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "out ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n",0x30);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                     "    gl_Position = a_position;\n",0x1e);
          if (uVar23 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "    var[0] = ${VAR_TYPE}(a_coords);\n",0x24);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "    var[1] = ${VAR_TYPE}(a_coords) * 0.5;\n",0x2a);
            lVar31 = 0x2c;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "    var[2] = ${VAR_TYPE}(a_coords) * 0.25;\n",0x2b);
            pcVar10 = "    var[3] = ${VAR_TYPE}(a_coords) * 0.125;\n";
          }
          else if (uVar23 == 1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "    var[ui_zero]  = ${VAR_TYPE}(a_coords);\n",0x2b);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "    var[ui_one]   = ${VAR_TYPE}(a_coords) * 0.5;\n",0x31);
            lVar31 = 0x33;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "    var[ui_two]   = ${VAR_TYPE}(a_coords) * 0.25;\n",0x32);
            pcVar10 = "    var[ui_three] = ${VAR_TYPE}(a_coords) * 0.125;\n";
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "    ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n",0x3d);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar19,lVar18);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"    {\n",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "        var[i] = ${VAR_TYPE}(coords);\n",0x26);
            lVar31 = 6;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "        coords = coords * 0.5;\n",0x1f);
            pcVar10 = "    }\n";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10,lVar31);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
          pcVar10 = glu::getGLSLVersionDeclaration(GVar2);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)&vertTemplate +
                            (int)frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream[-3] + 800);
          }
          else {
            sVar12 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10,sVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                     "precision mediump int;\n",0x17);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                     "layout(location = 0) out mediump vec4 o_color;\n",0x2f);
          lVar31 = 0x37;
          pcVar10 = "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
          if (lVar29 == 1) {
LAB_00daa430:
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10,lVar31);
          }
          else {
            lVar31 = 0x15;
            pcVar10 = "uniform int ui_four;\n";
            if (lVar29 == 3) goto LAB_00daa430;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                     "in ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n",0x2f);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                     "   ${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",0x34);
          if (lVar29 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                       "   res += var[0];\n",0x12);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                       "   res += var[1];\n",0x12);
            lVar31 = 0x12;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                       "   res += var[2];\n",0x12);
            pcVar10 = "   res += var[3];\n";
          }
          else if (lVar29 == 1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                       "   res += var[ui_zero];\n",0x18);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                       "   res += var[ui_one];\n",0x17);
            lVar31 = 0x19;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                       "   res += var[ui_two];\n",0x17);
            pcVar10 = "   res += var[ui_three];\n";
          }
          else {
            pcVar10 = "    for (int i = 0; i < ui_four; i++)\n";
            if (lVar29 == 2) {
              pcVar10 = "    for (int i = 0; i < 4; i++)\n";
            }
            lVar27 = 0x25;
            if (lVar29 == 2) {
              lVar27 = 0x1f;
            }
            lVar31 = 0x16;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10 + 1,lVar27);
            pcVar10 = "       res += var[i];\n";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10,lVar31);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                     "   o_color = vec4(res${PADDING});\n",0x22);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
          params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &params._M_t._M_impl.super__Rb_tree_header._M_header;
          params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[9],_const_char_*,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [9])0x1bcbba9,(char **)&fragTemplate);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_p != &local_498) {
            operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
            operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                            vertTemplate.m_template.field_2._M_allocated_capacity + 1);
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x1c0b6e7);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_p != &local_498) {
            operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
            operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                            vertTemplate.m_template.field_2._M_allocated_capacity + 1);
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [10])0x1cfc2cb,(char (*) [8])0x1c0a4ed);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_p != &local_498) {
            operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
            operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                            vertTemplate.m_template.field_2._M_allocated_capacity + 1);
          }
          if (DVar1 == TYPE_FLOAT_VEC3) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x1bc8831);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          else if (DVar1 == TYPE_FLOAT_VEC2) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x1bc882c);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          else if (DVar1 == TYPE_FLOAT) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0");
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          else {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [8])"PADDING",
                       (char (*) [1])(glcts::fixed_sample_locations_values + 1));
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_p != &local_498) {
            operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
            operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                            vertTemplate.m_template.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                     (allocator<char> *)&local_400);
          tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
            operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                            fragTemplate.m_template.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
            operator_delete(vertexShaderSource._M_dataplus._M_p,
                            vertexShaderSource.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vertexShaderSource,local_400._M_dataplus._M_p,&local_461);
          tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
            operator_delete(vertexShaderSource._M_dataplus._M_p,
                            vertexShaderSource.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._M_dataplus._M_p != &local_400.field_2) {
            operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
          }
          tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
          tcu::StringTemplate::specialize(&local_400,&fragTemplate,&params);
          if (DVar1 - TYPE_FLOAT < 4) {
            p_Var28 = (ShaderEvalFunc)(&PTR_evalArrayCoordsFloat_0215c450)[DVar1 - TYPE_FLOAT];
          }
          else {
            p_Var28 = (ShaderEvalFunc)0x0;
          }
          pSVar13 = (ShaderIndexingCase *)operator_new(0x130);
          ShaderIndexingCase::ShaderIndexingCase
                    (pSVar13,local_3e0,_Var6._M_p,_Var5._M_p,true,DVar1,p_Var28,
                     vertexShaderSource._M_dataplus._M_p,local_400._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._M_dataplus._M_p != &local_400.field_2) {
            operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
            operator_delete(vertexShaderSource._M_dataplus._M_p,
                            vertexShaderSource.field_2._M_allocated_capacity + 1);
          }
          tcu::StringTemplate::~StringTemplate(&fragTemplate);
          tcu::StringTemplate::~StringTemplate(&vertTemplate);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&params._M_t);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
          std::ios_base::~ios_base
                    ((ios_base *)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70
                    );
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
          std::ios_base::~ios_base
                    ((ios_base *)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70)
          ;
          tcu::TestNode::addChild(pTVar9,(TestNode *)pSVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)desc._M_dataplus._M_p != &desc.field_2) {
            operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 != 4);
      uVar23 = uVar23 + 1;
    } while (uVar23 != 4);
    lVar24 = lVar24 + 1;
    if (lVar24 == 4) {
      pTVar9 = (TestNode *)operator_new(0x78);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,pCVar3->m_testCtx,"uniform_array",
                 "Uniform array access tests.");
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_0210f0c8;
      pTVar9[1]._vptr_TestNode = (_func_int **)pCVar3;
      tcu::TestNode::addChild((TestNode *)this,pTVar9);
      lVar24 = 0;
      do {
        DVar1 = deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[lVar24];
        uVar23 = 0;
        do {
          lVar25 = 0x1d;
          if (uVar23 == 1) {
            lVar25 = 0x37;
          }
          local_3e0 = (Context *)(&getIndexAccessTypeName(deqp::IndexAccessType)::s_names)[uVar23];
          pcVar26 = "uniform mediump int ui_four;\n";
          if (uVar23 == 1) {
            pcVar26 = "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n";
          }
          pcVar19 = "    for (int i = 0; i < ui_four; i++)\n";
          if (uVar23 == 2) {
            pcVar19 = "    for (int i = 0; i < 4; i++)\n";
          }
          lVar18 = 0x23;
          if (uVar23 == 2) {
            lVar18 = 0x1d;
          }
          lVar29 = 0;
          do {
            puVar33 = &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
            glu::getShaderTypeName
                      (*(ShaderType *)
                        ((long)deqp::gles2::Functional::UniformCase::randomFeatures(unsigned_int)::
                               arrayUsageChoices + lVar29));
            pcVar10 = glu::getDataTypeName(DVar1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&params,pcVar10,(allocator<char> *)&fragTemplate);
            plVar11 = (long *)std::__cxx11::string::append((char *)&params);
            vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
            psVar21 = (size_type *)(plVar11 + 2);
            if ((size_type *)*plVar11 == psVar21) {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
              vertTemplate.m_template.field_2._8_8_ = plVar11[3];
            }
            else {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
              vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
            }
            vertTemplate.m_template._M_string_length = plVar11[1];
            *plVar11 = (long)psVar21;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
            pp_Var22 = (_func_int **)(plVar11 + 2);
            if ((_func_int **)*plVar11 == pp_Var22) {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)puVar33;
            }
            else {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar11;
            }
            frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
            *plVar11 = (long)pp_Var22;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
            pp_Var22 = (_func_int **)(plVar11 + 2);
            if ((_func_int **)*plVar11 == pp_Var22) {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
            }
            else {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar11;
            }
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
            *plVar11 = (long)pp_Var22;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
            name._M_dataplus._M_p = (pointer)&name.field_2;
            psVar21 = (size_type *)(plVar11 + 2);
            if ((size_type *)*plVar11 == psVar21) {
              name.field_2._M_allocated_capacity = *psVar21;
              name.field_2._8_8_ = plVar11[3];
            }
            else {
              name.field_2._M_allocated_capacity = *psVar21;
              name._M_dataplus._M_p = (pointer)*plVar11;
            }
            name._M_string_length = plVar11[1];
            *plVar11 = (long)psVar21;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
              operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)puVar33) {
              operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            params._M_t._M_impl._0_8_ =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&params,"Uniform array with ","");
            plVar11 = (long *)std::__cxx11::string::append((char *)&params);
            vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
            psVar21 = (size_type *)(plVar11 + 2);
            if ((size_type *)*plVar11 == psVar21) {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
              vertTemplate.m_template.field_2._8_8_ = plVar11[3];
            }
            else {
              vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
              vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
            }
            vertTemplate.m_template._M_string_length = plVar11[1];
            *plVar11 = (long)psVar21;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
            pp_Var22 = (_func_int **)(plVar11 + 2);
            if ((_func_int **)*plVar11 == pp_Var22) {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)puVar33;
            }
            else {
              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar11;
            }
            frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
            *plVar11 = (long)pp_Var22;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
            pp_Var22 = (_func_int **)(plVar11 + 2);
            if ((_func_int **)*plVar11 == pp_Var22) {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
            }
            else {
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)*plVar11;
            }
            vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
            *plVar11 = (long)pp_Var22;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
            desc._M_dataplus._M_p = (pointer)&desc.field_2;
            psVar21 = (size_type *)(plVar11 + 2);
            if ((size_type *)*plVar11 == psVar21) {
              desc.field_2._M_allocated_capacity = *psVar21;
              desc.field_2._8_8_ = plVar11[3];
            }
            else {
              desc.field_2._M_allocated_capacity = *psVar21;
              desc._M_dataplus._M_p = (pointer)*plVar11;
            }
            desc._M_string_length = plVar11[1];
            *plVar11 = (long)psVar21;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
              operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)puVar33) {
              operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,
                              frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)params._M_t._M_impl._0_8_,
                              (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            _Var6._M_p = name._M_dataplus._M_p;
            _Var5._M_p = desc._M_dataplus._M_p;
            pCVar3 = (this->super_TestCaseGroup).m_context;
            GVar2 = this->m_glslVersion;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
            poVar32 = (ostringstream *)&frag;
            if (lVar29 == 0) {
              poVar32 = (ostringstream *)&vtx;
            }
            pcVar10 = glu::getGLSLVersionDeclaration(GVar2);
            if (pcVar10 == (char *)0x0) {
              std::ios::clear((int)&vertTemplate +
                              (int)vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream[-3] + 0x1a8);
            }
            else {
              sVar12 = strlen(pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
            pcVar10 = glu::getGLSLVersionDeclaration(GVar2);
            if (pcVar10 == (char *)0x0) {
              std::ios::clear((int)&vertTemplate +
                              (int)frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream[-3] + 800);
            }
            else {
              sVar12 = strlen(pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "in highp vec4 a_position;\n",0x1a);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "in highp vec4 a_coords;\n",0x18);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                       "layout(location = 0) out mediump vec4 o_color;\n",0x2f);
            if (lVar29 == 0) {
              lVar31 = 0x19;
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "out mediump vec4 v_color;\n",0x1a);
              pcVar10 = "in mediump vec4 v_color;\n";
            }
            else {
              lVar31 = 0x1a;
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "out mediump vec4 v_coords;\n",0x1b);
              pcVar10 = "in mediump vec4 v_coords;\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10,lVar31);
            if ((uVar23 | 2) == 3) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar32,pcVar26,lVar25);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar32,"uniform ${PRECISION} ${VAR_TYPE} u_arr[${ARRAY_LEN}];\n",
                       0x36);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                       "    gl_Position = a_position;\n",0x1e);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar32," ${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",0x32
                      );
            if (uVar23 == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar32," res += u_arr[0];\n",0x12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar32," res += u_arr[1];\n",0x12);
              lVar31 = 0x12;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar32," res += u_arr[2];\n",0x12);
              pcVar10 = " res += u_arr[3];\n";
            }
            else if (uVar23 == 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar32," res += u_arr[ui_zero];\n",0x18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar32," res += u_arr[ui_one];\n",0x17);
              lVar31 = 0x19;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar32," res += u_arr[ui_two];\n",0x17);
              pcVar10 = " res += u_arr[ui_three];\n";
            }
            else {
              lVar31 = 0x16;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar32,pcVar19 + 3,lVar18);
              pcVar10 = "     res += u_arr[i];\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar32,pcVar10,lVar31);
            if (lVar29 == 0) {
              lVar31 = 0x16;
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "    v_color = vec4(res${PADDING});\n",0x23);
              pcVar10 = "   o_color = v_color;\n";
            }
            else {
              lVar31 = 0x22;
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "    v_coords = a_coords;\n",0x19);
              pcVar10 = "   o_color = vec4(res${PADDING});\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10,lVar31);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
            params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &params._M_t._M_impl.super__Rb_tree_header._M_header;
            params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[9],_const_char_*,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [9])0x1bcbba9,(char **)&fragTemplate);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_p != &local_498) {
              operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x1c0b6e7);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_p != &local_498) {
              operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate,(char (*) [10])0x1cfc2cb,(char (*) [8])0x1c0a4ed);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&params,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&vertTemplate);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_p != &local_498) {
              operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if (DVar1 == TYPE_FLOAT_VEC3) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x1bc8831);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            else if (DVar1 == TYPE_FLOAT_VEC2) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x1bc882c);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            else if (DVar1 == TYPE_FLOAT) {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0");
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            else {
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])"PADDING",
                         (char (*) [1])(glcts::fixed_sample_locations_values + 1));
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_p != &local_498) {
              operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
              operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                              vertTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                       (allocator<char> *)&local_400);
            tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
              operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                              fragTemplate.m_template.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vertexShaderSource,local_400._M_dataplus._M_p,&local_461);
            tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_400._M_dataplus._M_p != &local_400.field_2) {
              operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1
                             );
            }
            tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
            tcu::StringTemplate::specialize(&local_400,&fragTemplate,&params);
            if (DVar1 - TYPE_FLOAT < 4) {
              p_Var28 = (ShaderEvalFunc)(&PTR_evalArrayUniformFloat_0215c430)[DVar1 - TYPE_FLOAT];
            }
            else {
              p_Var28 = (ShaderEvalFunc)0x0;
            }
            pSVar13 = (ShaderIndexingCase *)operator_new(0x130);
            ShaderIndexingCase::ShaderIndexingCase
                      (pSVar13,pCVar3,_Var6._M_p,_Var5._M_p,lVar29 == 0,DVar1,p_Var28,
                       vertexShaderSource._M_dataplus._M_p,local_400._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_400._M_dataplus._M_p != &local_400.field_2) {
              operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
              operator_delete(vertexShaderSource._M_dataplus._M_p,
                              vertexShaderSource.field_2._M_allocated_capacity + 1);
            }
            tcu::StringTemplate::~StringTemplate(&fragTemplate);
            tcu::StringTemplate::~StringTemplate(&vertTemplate);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(&params._M_t);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
            tcu::TestNode::addChild(pTVar9,(TestNode *)pSVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)desc._M_dataplus._M_p != &desc.field_2) {
              operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
            }
            lVar29 = lVar29 + 4;
          } while (lVar29 == 4);
          uVar23 = uVar23 + 1;
        } while (uVar23 != 4);
        lVar24 = lVar24 + 1;
      } while (lVar24 != 4);
      pTVar9 = (TestNode *)operator_new(0x78);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,pCVar3->m_testCtx,"tmp_array",
                 "Temporary array access tests.");
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_0210f0c8;
      pTVar9[1]._vptr_TestNode = (_func_int **)pCVar3;
      tcu::TestNode::addChild((TestNode *)this,pTVar9);
      lVar24 = 0;
      do {
        DVar1 = deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[lVar24];
        local_408 = 0;
        do {
          uVar15 = 1;
          do {
            iVar17 = (int)local_408;
            uVar30 = 0;
            if (iVar17 == 0) {
              uVar30 = uVar15;
            }
            uVar23 = (ulong)uVar15;
            if (iVar17 == 0) {
              uVar23 = local_408;
            }
            local_3e0 = (Context *)(&getIndexAccessTypeName(deqp::IndexAccessType)::s_names)[uVar23]
            ;
            iVar16 = (int)uVar23;
            pcVar19 = "    for (int i = 0; i < ui_four; i++)\n";
            pcVar26 = "    for (int i = 0; i < ui_four; i++)\n";
            if (iVar16 == 2) {
              pcVar26 = "    for (int i = 0; i < 4; i++)\n";
            }
            lVar25 = 0x23;
            if (iVar16 == 2) {
              lVar25 = 0x1d;
            }
            if (uVar30 == 2) {
              pcVar19 = "    for (int i = 0; i < 4; i++)\n";
            }
            lVar18 = 0x23;
            if (uVar30 == 2) {
              lVar18 = 0x1d;
            }
            lVar29 = 0;
            do {
              puVar33 = &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              glu::getShaderTypeName
                        (*(ShaderType *)
                          ((long)deqp::gles2::Functional::UniformCase::randomFeatures(unsigned_int)
                                 ::arrayUsageChoices + lVar29));
              pcVar10 = glu::getDataTypeName(DVar1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar10,(allocator<char> *)&local_400);
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                fragTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              fragTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar20 = plVar11 + 2;
              if ((long *)*plVar11 == plVar20) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar20;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar11[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar20;
                params._M_t._M_impl._0_8_ = (long *)*plVar11;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar11[1];
              *plVar11 = (long)plVar20;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                vertTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              vertTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              pp_Var22 = (_func_int **)(plVar11 + 2);
              if ((_func_int **)*plVar11 == pp_Var22) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)puVar33;
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar11;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
              *plVar11 = (long)pp_Var22;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var22 = (_func_int **)(plVar11 + 2);
              if ((_func_int **)*plVar11 == pp_Var22) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar11;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
              *plVar11 = (long)pp_Var22;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                name.field_2._M_allocated_capacity = *psVar21;
                name.field_2._8_8_ = plVar11[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar21;
                name._M_dataplus._M_p = (pointer)*plVar11;
              }
              name._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)puVar33) {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Temporary array with ","");
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                fragTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              fragTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar20 = plVar11 + 2;
              if ((long *)*plVar11 == plVar20) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar20;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar11[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar20;
                params._M_t._M_impl._0_8_ = (long *)*plVar11;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar11[1];
              *plVar11 = (long)plVar20;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                vertTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              vertTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              pp_Var22 = (_func_int **)(plVar11 + 2);
              if ((_func_int **)*plVar11 == pp_Var22) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)puVar33;
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar11;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
              *plVar11 = (long)pp_Var22;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var22 = (_func_int **)(plVar11 + 2);
              if ((_func_int **)*plVar11 == pp_Var22) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar11;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
              *plVar11 = (long)pp_Var22;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                desc.field_2._M_allocated_capacity = *psVar21;
                desc.field_2._8_8_ = plVar11[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar21;
                desc._M_dataplus._M_p = (pointer)*plVar11;
              }
              desc._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)puVar33) {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              _Var6._M_p = name._M_dataplus._M_p;
              _Var5._M_p = desc._M_dataplus._M_p;
              pCVar3 = (this->super_TestCaseGroup).m_context;
              GVar2 = this->m_glslVersion;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar32 = (ostringstream *)&frag;
              if (lVar29 == 0) {
                poVar32 = (ostringstream *)&vtx;
              }
              pcVar10 = glu::getGLSLVersionDeclaration(GVar2);
              if (pcVar10 == (char *)0x0) {
                std::ios::clear((int)&vertTemplate +
                                (int)vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream[-3] + 0x1a8);
              }
              else {
                sVar12 = strlen(pcVar10);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10,sVar12);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              pcVar10 = glu::getGLSLVersionDeclaration(GVar2);
              if (pcVar10 == (char *)0x0) {
                std::ios::clear((int)&vertTemplate +
                                (int)frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream[-3] + 800);
              }
              else {
                sVar12 = strlen(pcVar10);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10,sVar12);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "in highp vec4 a_position;\n",0x1a);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "in highp vec4 a_coords;\n",0x18);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                         "layout(location = 0) out mediump vec4 o_color;\n",0x2f);
              if (lVar29 == 0) {
                lVar31 = 0x19;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "out mediump vec4 v_color;\n",0x1a);
                pcVar10 = "in mediump vec4 v_color;\n";
              }
              else {
                lVar31 = 0x1a;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "out mediump vec4 v_coords;\n",0x1b);
                pcVar10 = "in mediump vec4 v_coords;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10,lVar31);
              if (uVar30 == 1 || iVar16 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32,
                           "uniform mediump int ui_zero, ui_one, ui_two, ui_three;\n",0x37);
              }
              if (uVar30 == 3 || iVar16 == 3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32,"uniform mediump int ui_four;\n",0x1d);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "    gl_Position = a_position;\n",0x1e);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",
                         0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              pcVar10 = " ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
              if (lVar29 == 0) {
                pcVar10 = " ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar32,pcVar10,0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar32," ${PRECISION} ${VAR_TYPE} arr[${ARRAY_LEN}];\n",0x2d);
              if (iVar17 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32," arr[0] = ${VAR_TYPE}(coords);\n",0x1f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32," arr[1] = ${VAR_TYPE}(coords) * 0.5;\n",0x25);
                lVar31 = 0x27;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32," arr[2] = ${VAR_TYPE}(coords) * 0.25;\n",0x26);
                pcVar10 = " arr[3] = ${VAR_TYPE}(coords) * 0.125;\n";
              }
              else if (iVar16 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32," arr[ui_zero]  = ${VAR_TYPE}(coords);\n",0x26);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32," arr[ui_one]   = ${VAR_TYPE}(coords) * 0.5;\n",0x2c);
                lVar31 = 0x2e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32," arr[ui_two]   = ${VAR_TYPE}(coords) * 0.25;\n",0x2d)
                ;
                pcVar10 = " arr[ui_three] = ${VAR_TYPE}(coords) * 0.125;\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32,pcVar26 + 3,lVar25);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar32," {\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32,"     arr[i] = ${VAR_TYPE}(coords);\n",0x23);
                lVar31 = 3;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32,"     coords = coords * 0.5;\n",0x1c);
                pcVar10 = " }\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar32,pcVar10,lVar31);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar32," ${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",
                         0x32);
              if (iVar17 == 0) {
                if (uVar30 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32," res += arr[ui_zero];\n",0x16);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32," res += arr[ui_one];\n",0x15);
                  lVar31 = 0x17;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32," res += arr[ui_two];\n",0x15);
                  pcVar10 = " res += arr[ui_three];\n";
                }
                else {
                  lVar31 = 0x14;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32,pcVar19 + 3,lVar18);
                  pcVar10 = "     res += arr[i];\n";
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32," res += arr[0];\n",0x10);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32," res += arr[1];\n",0x10);
                lVar31 = 0x10;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32," res += arr[2];\n",0x10);
                pcVar10 = " res += arr[3];\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar32,pcVar10,lVar31);
              if (lVar29 == 0) {
                lVar31 = 0x16;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "    v_color = vec4(res${PADDING});\n",0x23);
                pcVar10 = "   o_color = v_color;\n";
              }
              else {
                lVar31 = 0x22;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "    v_coords = a_coords;\n",0x19);
                pcVar10 = "   o_color = vec4(res${PADDING});\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar10,lVar31);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])0x1bcbba9,(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0x1c0b6e7);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0x1cfc2cb,(char (*) [8])0x1c0a4ed);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if (DVar1 == TYPE_FLOAT_VEC3) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x1bc8831);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (DVar1 == TYPE_FLOAT_VEC2) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x1bc882c);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (DVar1 == TYPE_FLOAT) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])", 0.0, 0.0, 1.0"
                          );
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",
                           (char (*) [1])(glcts::fixed_sample_locations_values + 1));
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                         (allocator<char> *)&local_400);
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,local_400._M_dataplus._M_p,&local_461);
              tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_400._M_dataplus._M_p != &local_400.field_2) {
                operator_delete(local_400._M_dataplus._M_p,
                                local_400.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize(&local_400,&fragTemplate,&params);
              if (DVar1 - TYPE_FLOAT < 4) {
                p_Var28 = (ShaderEvalFunc)(&PTR_evalArrayCoordsFloat_0215c450)[DVar1 - TYPE_FLOAT];
              }
              else {
                p_Var28 = (ShaderEvalFunc)0x0;
              }
              pSVar13 = (ShaderIndexingCase *)operator_new(0x130);
              ShaderIndexingCase::ShaderIndexingCase
                        (pSVar13,pCVar3,_Var6._M_p,_Var5._M_p,lVar29 == 0,DVar1,p_Var28,
                         vertexShaderSource._M_dataplus._M_p,local_400._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_400._M_dataplus._M_p != &local_400.field_2) {
                operator_delete(local_400._M_dataplus._M_p,
                                local_400.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate(&fragTemplate);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&params._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              tcu::TestNode::addChild(pTVar9,(TestNode *)pSVar13);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar29 = lVar29 + 4;
            } while (lVar29 == 4);
            uVar15 = uVar15 + 1;
          } while (uVar15 != 4);
          local_408 = (ulong)(iVar17 + 1);
        } while (iVar17 == 0);
        lVar24 = lVar24 + 1;
      } while (lVar24 != 4);
      pTVar9 = (TestNode *)operator_new(0x78);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,pCVar3->m_testCtx,"vector_subscript",
                 "Vector subscript indexing.");
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_0210f0c8;
      pTVar9[1]._vptr_TestNode = (_func_int **)pCVar3;
      tcu::TestNode::addChild((TestNode *)this,pTVar9);
      lVar24 = 0;
      do {
        DVar1 = init::s_vectorTypes[lVar24];
        local_348 = 0;
        do {
          uVar15 = 2;
          do {
            iVar17 = (int)local_348;
            uVar30 = 0;
            if (iVar17 == 0) {
              uVar30 = uVar15;
            }
            uVar23 = (ulong)uVar15;
            if (iVar17 == 0) {
              uVar23 = local_348;
            }
            local_3e0 = (Context *)
                        (&getVectorAccessTypeName(deqp::VectorAccessType)::s_names)[uVar23];
            iVar16 = (int)uVar23;
            lVar25 = 0;
            do {
              glu::getShaderTypeName
                        (*(ShaderType *)
                          ((long)deqp::gles2::Functional::UniformCase::randomFeatures(unsigned_int)
                                 ::arrayUsageChoices + lVar25));
              pcVar26 = glu::getDataTypeName(DVar1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar26,(allocator<char> *)&local_400);
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                fragTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              fragTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar20 = plVar11 + 2;
              if ((long *)*plVar11 == plVar20) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar20;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar11[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar20;
                params._M_t._M_impl._0_8_ = (long *)*plVar11;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar11[1];
              *plVar11 = (long)plVar20;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                vertTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              vertTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10
              ;
              pp_Var22 = (_func_int **)(plVar11 + 2);
              if ((_func_int **)*plVar11 == pp_Var22) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar11;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
              *plVar11 = (long)pp_Var22;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var22 = (_func_int **)(plVar11 + 2);
              if ((_func_int **)*plVar11 == pp_Var22) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar11;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
              *plVar11 = (long)pp_Var22;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                name.field_2._M_allocated_capacity = *psVar21;
                name.field_2._8_8_ = plVar11[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar21;
                name._M_dataplus._M_p = (pointer)*plVar11;
              }
              name._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Vector subscript access with ","");
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                fragTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              fragTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar20 = plVar11 + 2;
              if ((long *)*plVar11 == plVar20) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar20;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar11[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar20;
                params._M_t._M_impl._0_8_ = (long *)*plVar11;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar11[1];
              *plVar11 = (long)plVar20;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                vertTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              vertTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10
              ;
              pp_Var22 = (_func_int **)(plVar11 + 2);
              if ((_func_int **)*plVar11 == pp_Var22) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar11;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
              *plVar11 = (long)pp_Var22;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var22 = (_func_int **)(plVar11 + 2);
              if ((_func_int **)*plVar11 == pp_Var22) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar11;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
              *plVar11 = (long)pp_Var22;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                desc.field_2._M_allocated_capacity = *psVar21;
                desc.field_2._8_8_ = plVar11[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar21;
                desc._M_dataplus._M_p = (pointer)*plVar11;
              }
              desc._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              _Var6._M_p = name._M_dataplus._M_p;
              _Var5._M_p = desc._M_dataplus._M_p;
              pCVar3 = (this->super_TestCaseGroup).m_context;
              GVar2 = this->m_glslVersion;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar32 = (ostringstream *)&frag;
              if (lVar25 == 0) {
                poVar32 = (ostringstream *)&vtx;
              }
              iVar7 = glu::getDataTypeScalarSize(DVar1);
              pcVar26 = getIntUniformName(iVar7);
              pcVar19 = glu::getGLSLVersionDeclaration(GVar2);
              if (pcVar19 == (char *)0x0) {
                std::ios::clear((int)&vertTemplate +
                                (int)vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream[-3] + 0x1a8);
              }
              else {
                sVar12 = strlen(pcVar19);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar19,sVar12);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              pcVar19 = glu::getGLSLVersionDeclaration(GVar2);
              if (pcVar19 == (char *)0x0) {
                std::ios::clear((int)&vertTemplate +
                                (int)frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream[-3] + 800);
              }
              else {
                sVar12 = strlen(pcVar19);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar19,sVar12);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "in highp vec4 a_position;\n",0x1a);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "in highp vec4 a_coords;\n",0x18);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                         "layout(location = 0) out mediump vec4 o_color;\n",0x2f);
              if (lVar25 == 0) {
                lVar18 = 0x19;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "out mediump vec3 v_color;\n",0x1a);
                pcVar19 = "in mediump vec3 v_color;\n";
              }
              else {
                lVar18 = 0x1a;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "out mediump vec4 v_coords;\n",0x1b);
                pcVar19 = "in mediump vec4 v_coords;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar19,lVar18);
              if (uVar30 == 3 || iVar16 == 3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32,"uniform mediump int ui_zero",0x1b);
                if (1 < iVar7) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32,", ui_one",8);
                }
                if (2 < iVar7) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32,", ui_two",8);
                }
                if (3 < iVar7) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32,", ui_three",10);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar32,";\n",2);
              }
              iVar8 = (int)poVar32;
              if (uVar30 == 5 || iVar16 == 5) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32,"uniform mediump int ",0x14);
                if (pcVar26 == (char *)0x0) {
                  std::ios::clear(iVar8 + (int)*(undefined8 *)(*(long *)poVar32 + -0x18));
                }
                else {
                  sVar12 = strlen(pcVar26);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32,pcVar26,sVar12);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar32,";\n",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "    gl_Position = a_position;\n",0x1e);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",
                         0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              pcVar19 = " ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
              if (lVar25 == 0) {
                pcVar19 = " ${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar32,pcVar19,0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar32," ${PRECISION} ${VAR_TYPE} tmp;\n",0x1f);
              if (iVar16 == 0) {
                lVar18 = 0x43;
                pcVar19 = " tmp = coords.${SWIZZLE} * vec4(1.0, 0.5, 0.25, 0.125).${SWIZZLE};\n";
LAB_00dad963:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32,pcVar19,lVar18);
              }
              else {
                if (iVar16 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32," tmp[0] = coords.x;\n",0x14);
                  if (1 < iVar7) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,"    tmp[1] = coords.y * 0.5;\n",0x1d);
                  }
                  if (2 < iVar7) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,"    tmp[2] = coords.z * 0.25;\n",0x1e);
                  }
                  lVar18 = 0x1f;
                  pcVar19 = "    tmp[3] = coords.w * 0.125;\n";
                }
                else if (iVar16 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32," tmp.x = coords.x;\n",0x13);
                  if (1 < iVar7) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,"    tmp.y = coords.y * 0.5;\n",0x1c);
                  }
                  if (2 < iVar7) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,"    tmp.z = coords.z * 0.25;\n",0x1d);
                  }
                  lVar18 = 0x1e;
                  pcVar19 = "    tmp.w = coords.w * 0.125;\n";
                }
                else {
                  if (iVar16 != 3) {
                    if (iVar16 == 4) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar32," for (int i = 0; i < ",0x15);
                      poVar14 = (ostringstream *)std::ostream::operator<<(poVar32,iVar7);
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar32," for (int i = 0; i < ",0x15);
                      poVar14 = poVar32;
                      if (pcVar26 == (char *)0x0) {
                        std::ios::clear(iVar8 + (int)*(undefined8 *)(*(long *)poVar32 + -0x18));
                      }
                      else {
                        sVar12 = strlen(pcVar26);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar32,pcVar26,sVar12);
                      }
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar14,"; i++)\n",7);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar32," {\n",3);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,"     tmp[i] = coords.x;\n",0x18);
                    lVar18 = 3;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,"     coords = coords.${ROT_SWIZZLE} * 0.5;\n",
                               0x2b);
                    pcVar19 = " }\n";
                    goto LAB_00dad963;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32," tmp[ui_zero]  = coords.x;\n",0x1b);
                  if (1 < iVar7) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,"    tmp[ui_one]   = coords.y * 0.5;\n",0x24);
                  }
                  if (2 < iVar7) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,"    tmp[ui_two]   = coords.z * 0.25;\n",0x25);
                  }
                  lVar18 = 0x26;
                  pcVar19 = "    tmp[ui_three] = coords.w * 0.125;\n";
                }
                if (3 < iVar7) goto LAB_00dad963;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar32," ${PRECISION} float res = 0.0;\n",0x1f);
              if (uVar30 == 0) {
                lVar18 = 0x23;
                pcVar26 = " res = dot(tmp, ${VAR_TYPE}(1.0));\n";
LAB_00dadb5a:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32,pcVar26,lVar18);
              }
              else {
                if (uVar30 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32," res += tmp[0];\n",0x10);
                  if (1 < iVar7) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,"    res += tmp[1];\n",0x13);
                  }
                  if (2 < iVar7) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,"    res += tmp[2];\n",0x13);
                  }
                  lVar18 = 0x13;
                  pcVar26 = "    res += tmp[3];\n";
                }
                else if (uVar30 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32," res += tmp.x;\n",0xf);
                  if (1 < iVar7) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,"    res += tmp.y;\n",0x12);
                  }
                  if (2 < iVar7) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,"    res += tmp.z;\n",0x12);
                  }
                  lVar18 = 0x12;
                  pcVar26 = "    res += tmp.w;\n";
                }
                else {
                  if (uVar30 != 3) {
                    if (uVar30 == 4) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar32," for (int i = 0; i < ",0x15);
                      poVar14 = (ostringstream *)std::ostream::operator<<(poVar32,iVar7);
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar32," for (int i = 0; i < ",0x15);
                      poVar14 = poVar32;
                      if (pcVar26 == (char *)0x0) {
                        std::ios::clear(iVar8 + (int)*(undefined8 *)(*(long *)poVar32 + -0x18));
                      }
                      else {
                        sVar12 = strlen(pcVar26);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar32,pcVar26,sVar12);
                      }
                    }
                    lVar18 = 0x14;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar14,"; i++)\n",7);
                    pcVar26 = "     res += tmp[i];\n";
                    goto LAB_00dadb5a;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32," res += tmp[ui_zero];\n",0x16);
                  if (1 < iVar7) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,"    res += tmp[ui_one];\n",0x18);
                  }
                  if (2 < iVar7) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,"    res += tmp[ui_two];\n",0x18);
                  }
                  lVar18 = 0x1a;
                  pcVar26 = "    res += tmp[ui_three];\n";
                }
                if (3 < iVar7) goto LAB_00dadb5a;
              }
              if (lVar25 == 0) {
                lVar18 = 0x25;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "    v_color = vec3(res);\n",0x19);
                pcVar26 = "   o_color = vec4(v_color.rgb, 1.0);\n";
              }
              else {
                lVar18 = 0x23;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "    v_coords = a_coords;\n",0x19);
                pcVar26 = "   o_color = vec4(vec3(res), 1.0);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar26,lVar18);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])0x1bcbba9,(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0x1cfc2cb,(char (*) [8])0x1c0a4ed);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_*&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])0x1aede12,
                         (char **)(createVectorSubscriptCase(deqp::Context&,char_const*,char_const*,glu::GLSLVersion,bool,glu::DataType,deqp::VectorAccessType,deqp::VectorAccessType)
                                   ::s_swizzles + (long)iVar7 * 8));
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[12],_const_char_*&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [12])"ROT_SWIZZLE",
                         (char **)(createVectorSubscriptCase(deqp::Context&,char_const*,char_const*,glu::GLSLVersion,bool,glu::DataType,deqp::VectorAccessType,deqp::VectorAccessType)
                                   ::s_rotSwizzles + (long)iVar7 * 8));
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                         (allocator<char> *)&local_400);
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,local_400._M_dataplus._M_p,&local_461);
              tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_400._M_dataplus._M_p != &local_400.field_2) {
                operator_delete(local_400._M_dataplus._M_p,
                                local_400.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize(&local_400,&fragTemplate,&params);
              if (DVar1 - TYPE_FLOAT_VEC2 < 3) {
                p_Var28 = (ShaderEvalFunc)(&PTR_evalSubscriptVec2_0215c470)[DVar1 - TYPE_FLOAT_VEC2]
                ;
              }
              else {
                p_Var28 = (ShaderEvalFunc)0x0;
              }
              pSVar13 = (ShaderIndexingCase *)operator_new(0x130);
              ShaderIndexingCase::ShaderIndexingCase
                        (pSVar13,pCVar3,_Var6._M_p,_Var5._M_p,lVar25 == 0,DVar1,p_Var28,
                         vertexShaderSource._M_dataplus._M_p,local_400._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_400._M_dataplus._M_p != &local_400.field_2) {
                operator_delete(local_400._M_dataplus._M_p,
                                local_400.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate(&fragTemplate);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&params._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              tcu::TestNode::addChild(pTVar9,(TestNode *)pSVar13);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar25 = lVar25 + 4;
            } while (lVar25 == 4);
            uVar15 = uVar15 + 1;
          } while (uVar15 != 6);
          local_348 = (ulong)(iVar17 + 1);
        } while (iVar17 == 0);
        lVar24 = lVar24 + 1;
      } while (lVar24 != 3);
      pTVar9 = (TestNode *)operator_new(0x78);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,pCVar3->m_testCtx,"matrix_subscript",
                 "Matrix subscript indexing.");
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_0210f0c8;
      pTVar9[1]._vptr_TestNode = (_func_int **)pCVar3;
      tcu::TestNode::addChild((TestNode *)this,pTVar9);
      local_340 = 0;
      do {
        DVar1 = init::s_matrixTypes[local_340];
        local_3e0 = (Context *)0x0;
        do {
          iVar17 = 1;
          do {
            iVar7 = iVar17;
            iVar16 = 0;
            if ((int)local_3e0 == 0) {
              iVar7 = 0;
              iVar16 = iVar17;
            }
            lVar24 = 0;
            do {
              puVar33 = &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              glu::getShaderTypeName
                        (*(ShaderType *)
                          ((long)deqp::gles2::Functional::UniformCase::randomFeatures(unsigned_int)
                                 ::arrayUsageChoices + lVar24));
              pcVar26 = glu::getDataTypeName(DVar1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar26,(allocator<char> *)&local_400);
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                fragTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              fragTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar20 = plVar11 + 2;
              if ((long *)*plVar11 == plVar20) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar20;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar11[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar20;
                params._M_t._M_impl._0_8_ = (long *)*plVar11;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar11[1];
              *plVar11 = (long)plVar20;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                vertTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              vertTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              pp_Var22 = (_func_int **)(plVar11 + 2);
              if ((_func_int **)*plVar11 == pp_Var22) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)puVar33;
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar11;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
              *plVar11 = (long)pp_Var22;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var22 = (_func_int **)(plVar11 + 2);
              if ((_func_int **)*plVar11 == pp_Var22) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar11;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
              *plVar11 = (long)pp_Var22;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                name.field_2._M_allocated_capacity = *psVar21;
                name.field_2._8_8_ = plVar11[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar21;
                name._M_dataplus._M_p = (pointer)*plVar11;
              }
              name._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)puVar33) {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Vector subscript access with ","");
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                fragTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              fragTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar20 = plVar11 + 2;
              if ((long *)*plVar11 == plVar20) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar20;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar11[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar20;
                params._M_t._M_impl._0_8_ = (long *)*plVar11;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar11[1];
              *plVar11 = (long)plVar20;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                vertTemplate.m_template.field_2._8_8_ = plVar11[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar21;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar11;
              }
              vertTemplate.m_template._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              pp_Var22 = (_func_int **)(plVar11 + 2);
              if ((_func_int **)*plVar11 == pp_Var22) {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)puVar33;
              }
              else {
                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar11;
              }
              frag.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
              *plVar11 = (long)pp_Var22;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&frag);
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
              pp_Var22 = (_func_int **)(plVar11 + 2);
              if ((_func_int **)*plVar11 == pp_Var22) {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar11[3];
              }
              else {
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var22;
                vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                     (_func_int **)*plVar11;
              }
              vtx.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar11[1];
              *plVar11 = (long)pp_Var22;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar21 = (size_type *)(plVar11 + 2);
              if ((size_type *)*plVar11 == psVar21) {
                desc.field_2._M_allocated_capacity = *psVar21;
                desc.field_2._8_8_ = plVar11[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar21;
                desc._M_dataplus._M_p = (pointer)*plVar11;
              }
              desc._M_string_length = plVar11[1];
              *plVar11 = (long)psVar21;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if (vtx.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                vtx.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (frag.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                  (_func_int **)puVar33) {
                operator_delete(frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                frag.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              _Var6._M_p = name._M_dataplus._M_p;
              _Var5._M_p = desc._M_dataplus._M_p;
              pCVar3 = (this->super_TestCaseGroup).m_context;
              GVar2 = this->m_glslVersion;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar32 = (ostringstream *)&frag;
              if (lVar24 == 0) {
                poVar32 = (ostringstream *)&vtx;
              }
              iVar8 = glu::getDataTypeMatrixNumColumns(DVar1);
              vecSize = glu::getDataTypeMatrixNumRows(DVar1);
              pcVar26 = getIntUniformName(iVar8);
              dataType = glu::getDataTypeFloatVec(vecSize);
              pcVar19 = glu::getGLSLVersionDeclaration(GVar2);
              if (pcVar19 == (char *)0x0) {
                std::ios::clear((int)&vertTemplate +
                                (int)vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream[-3] + 0x1a8);
              }
              else {
                sVar12 = strlen(pcVar19);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar19,sVar12);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              pcVar19 = glu::getGLSLVersionDeclaration(GVar2);
              if (pcVar19 == (char *)0x0) {
                std::ios::clear((int)&vertTemplate +
                                (int)frag.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream[-3] + 800);
              }
              else {
                sVar12 = strlen(pcVar19);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar19,sVar12);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "in highp vec4 a_position;\n",0x1a);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "in highp vec4 a_coords;\n",0x18);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                         "layout(location = 0) out mediump vec4 o_color;\n",0x2f);
              if (lVar24 == 0) {
                lVar25 = 0x19;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "out mediump vec4 v_color;\n",0x1a);
                pcVar19 = "in mediump vec4 v_color;\n";
              }
              else {
                lVar25 = 0x1a;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "out mediump vec4 v_coords;\n",0x1b);
                pcVar19 = "in mediump vec4 v_coords;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar19,lVar25);
              if (iVar16 == 1 || iVar7 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32,"uniform mediump int ui_zero",0x1b);
                if (1 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32,", ui_one",8);
                }
                if (2 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32,", ui_two",8);
                }
                if (3 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32,", ui_three",10);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar32,";\n",2);
              }
              iVar4 = (int)poVar32;
              if (iVar16 == 3 || iVar7 == 3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32,"uniform mediump int ",0x14);
                if (pcVar26 == (char *)0x0) {
                  std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar32 + -0x18));
                }
                else {
                  sVar12 = strlen(pcVar26);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32,pcVar26,sVar12);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar32,";\n",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                         "    gl_Position = a_position;\n",0x1e);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",
                         0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
              pcVar19 = " ${PRECISION} vec4 coords = v_coords;\n";
              if (lVar24 == 0) {
                pcVar19 = " ${PRECISION} vec4 coords = a_coords;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar32,pcVar19,0x26);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar32," ${PRECISION} ${MAT_TYPE} tmp;\n",0x1f);
              if ((int)local_3e0 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32," tmp[0] = ${VEC_TYPE}(coords);\n",0x1f);
                if (1 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32,"   tmp[1] = ${VEC_TYPE}(coords.yzwx) * 0.5;\n",0x2c
                            );
                }
                if (2 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32,"   tmp[2] = ${VEC_TYPE}(coords.zwxy) * 0.25;\n",
                             0x2d);
                }
                lVar25 = 0x2e;
                pcVar19 = "   tmp[3] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
LAB_00daecd9:
                if (3 < iVar8) goto LAB_00daedb8;
              }
              else {
                if (iVar7 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32," tmp[ui_zero]  = ${VEC_TYPE}(coords);\n",0x26);
                  if (1 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,
                               "   tmp[ui_one]   = ${VEC_TYPE}(coords.yzwx) * 0.5;\n",0x33);
                  }
                  if (2 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,
                               "   tmp[ui_two]   = ${VEC_TYPE}(coords.zwxy) * 0.25;\n",0x34);
                  }
                  lVar25 = 0x35;
                  pcVar19 = "   tmp[ui_three] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
                  goto LAB_00daecd9;
                }
                if (iVar7 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32," for (int i = 0; i < ",0x15);
                  poVar14 = (ostringstream *)std::ostream::operator<<(poVar32,iVar8);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32," for (int i = 0; i < ",0x15);
                  poVar14 = poVar32;
                  if (pcVar26 == (char *)0x0) {
                    std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar32 + -0x18));
                  }
                  else {
                    sVar12 = strlen(pcVar26);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,pcVar26,sVar12);
                  }
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar14,"; i++)\n",7);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar32," {\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32,"     tmp[i] = ${VEC_TYPE}(coords);\n",0x23);
                lVar25 = 3;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32,"     coords = coords.yzwx * 0.5;\n",0x21);
                pcVar19 = " }\n";
LAB_00daedb8:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32,pcVar19,lVar25);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar32," ${PRECISION} ${VEC_TYPE} res = ${VEC_TYPE}(0.0);\n",
                         0x32);
              if ((int)local_3e0 == 0) {
                if (iVar16 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32," res += tmp[ui_zero];\n",0x16);
                  if (1 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,"   res += tmp[ui_one];\n",0x17);
                  }
                  if (2 < iVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,"   res += tmp[ui_two];\n",0x17);
                  }
                  lVar25 = 0x19;
                  pcVar26 = "    res += tmp[ui_three];\n";
                  goto LAB_00daee96;
                }
                if (iVar16 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32," for (int i = 0; i < ",0x15);
                  poVar14 = (ostringstream *)std::ostream::operator<<(poVar32,iVar8);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32," for (int i = 0; i < ",0x15);
                  poVar14 = poVar32;
                  if (pcVar26 == (char *)0x0) {
                    std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)poVar32 + -0x18));
                  }
                  else {
                    sVar12 = strlen(pcVar26);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar32,pcVar26,sVar12);
                  }
                }
                lVar25 = 0x14;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar14,"; i++)\n",7);
                pcVar26 = "     res += tmp[i];\n";
LAB_00daef39:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32,pcVar26,lVar25);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar32," res += tmp[0];\n",0x10);
                if (1 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32,"   res += tmp[1];\n",0x12);
                }
                if (2 < iVar8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar32,"   res += tmp[2];\n",0x12);
                }
                lVar25 = 0x12;
                pcVar26 = "    res += tmp[3];\n";
LAB_00daee96:
                pcVar26 = pcVar26 + 1;
                if (3 < iVar8) goto LAB_00daef39;
              }
              if (lVar24 == 0) {
                lVar25 = 0x16;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "    v_color = vec4(res${PADDING});\n",0x23);
                pcVar26 = "   o_color = v_color;\n";
              }
              else {
                lVar25 = 0x22;
                std::__ostream_insert<char,std::char_traits<char>>
                          (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
                           "    v_coords = a_coords;\n",0x19);
                pcVar26 = "   o_color = vec4(res${PADDING});\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar26,lVar25);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])"MAT_TYPE",(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(dataType);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])"VEC_TYPE",(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0x1cfc2cb,(char (*) [8])0x1c0a4ed);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if (vecSize == 3) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0x1bc8831);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (vecSize == 2) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0x1bc882c);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",
                           (char (*) [1])(glcts::fixed_sample_locations_values + 1));
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4a8._M_p != &local_498) {
                operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fragTemplate.m_template,vertexShaderSource._M_dataplus._M_p,
                         (allocator<char> *)&local_400);
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,local_400._M_dataplus._M_p,&local_461);
              tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_400._M_dataplus._M_p != &local_400.field_2) {
                operator_delete(local_400._M_dataplus._M_p,
                                local_400.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize(&local_400,&fragTemplate,&params);
              if (DVar1 - TYPE_FLOAT_MAT2 < 9) {
                p_Var28 = (ShaderEvalFunc)(&PTR_evalSubscriptMat2_0215c488)[DVar1 - TYPE_FLOAT_MAT2]
                ;
              }
              else {
                p_Var28 = (ShaderEvalFunc)0x0;
              }
              pSVar13 = (ShaderIndexingCase *)operator_new(0x130);
              ShaderIndexingCase::ShaderIndexingCase
                        (pSVar13,pCVar3,_Var6._M_p,_Var5._M_p,lVar24 == 0,DVar1,p_Var28,
                         vertexShaderSource._M_dataplus._M_p,local_400._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_400._M_dataplus._M_p != &local_400.field_2) {
                operator_delete(local_400._M_dataplus._M_p,
                                local_400.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate(&fragTemplate);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&params._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              tcu::TestNode::addChild(pTVar9,(TestNode *)pSVar13);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar24 = lVar24 + 4;
            } while (lVar24 == 4);
            iVar17 = iVar17 + 1;
          } while (iVar17 != 4);
          iVar17 = (int)local_3e0;
          uVar15 = iVar17 + 1;
          local_3e0 = (Context *)(ulong)uVar15;
        } while (iVar17 == 0);
        local_340 = local_340 + 1;
        if (local_340 == 9) {
          return uVar15;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void ShaderIndexingTests::init(void)
{
	static const DataType s_floatAndVecTypes[] = { TYPE_FLOAT, TYPE_FLOAT_VEC2, TYPE_FLOAT_VEC3, TYPE_FLOAT_VEC4 };

	static const ShaderType s_shaderTypes[] = { SHADERTYPE_VERTEX, SHADERTYPE_FRAGMENT };

	// Varying array access cases.
	{
		TestCaseGroup* varyingGroup = new TestCaseGroup(m_context, "varying_array", "Varying array access tests.");
		addChild(varyingGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int vertAccess = 0; vertAccess < INDEXACCESS_LAST; vertAccess++)
			{
				for (int fragAccess = 0; fragAccess < INDEXACCESS_LAST; fragAccess++)
				{
					if (vertAccess == INDEXACCESS_STATIC && fragAccess == INDEXACCESS_STATIC)
						continue;

					const char* vertAccessName = getIndexAccessTypeName((IndexAccessType)vertAccess);
					const char* fragAccessName = getIndexAccessTypeName((IndexAccessType)fragAccess);
					string		name =
						string(getDataTypeName(varType)) + "_" + vertAccessName + "_write_" + fragAccessName + "_read";
					string desc = string("Varying array with ") + vertAccessName + " write in vertex shader and " +
								  fragAccessName + " read in fragment shader.";
					varyingGroup->addChild(createVaryingArrayCase(m_context, name.c_str(), desc.c_str(), m_glslVersion,
																  varType, (IndexAccessType)vertAccess,
																  (IndexAccessType)fragAccess));
				}
			}
		}
	}

	// Uniform array access cases.
	{
		TestCaseGroup* uniformGroup = new TestCaseGroup(m_context, "uniform_array", "Uniform array access tests.");
		addChild(uniformGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
			{
				const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);
				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					ShaderType  shaderType	 = s_shaderTypes[shaderTypeNdx];
					const char* shaderTypeName = getShaderTypeName((ShaderType)shaderType);
					string name = string(getDataTypeName(varType)) + "_" + readAccessName + "_read_" + shaderTypeName;
					string desc =
						string("Uniform array with ") + readAccessName + " read in " + shaderTypeName + " shader.";
					bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
					uniformGroup->addChild(createUniformArrayCase(m_context, name.c_str(), desc.c_str(), m_glslVersion,
																  isVertexCase, varType, (IndexAccessType)readAccess));
				}
			}
		}
	}

	// Temporary array access cases.
	{
		TestCaseGroup* tmpGroup = new TestCaseGroup(m_context, "tmp_array", "Temporary array access tests.");
		addChild(tmpGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int isReadStatic = 0; isReadStatic < 2; isReadStatic++)
			{
				for (int access = INDEXACCESS_STATIC + 1; access < INDEXACCESS_LAST; access++)
				{
					IndexAccessType readAccess  = isReadStatic ? INDEXACCESS_STATIC : (IndexAccessType)access;
					IndexAccessType writeAccess = isReadStatic ? (IndexAccessType)access : INDEXACCESS_STATIC;

					const char* writeAccessName = getIndexAccessTypeName(writeAccess);
					const char* readAccessName  = getIndexAccessTypeName(readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType  shaderType	 = s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName = getShaderTypeName((ShaderType)shaderType);
						string		name = string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" +
									  readAccessName + "_read_" + shaderTypeName;
						string desc = string("Temporary array with ") + writeAccessName + " write and " +
									  readAccessName + " read in " + shaderTypeName + " shader.";
						bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						tmpGroup->addChild(createTmpArrayCase(m_context, name.c_str(), desc.c_str(), m_glslVersion,
															  isVertexCase, varType, (IndexAccessType)writeAccess,
															  (IndexAccessType)readAccess));
					}
				}
			}
		}
	}

	// Vector indexing with subscripts.
	{
		TestCaseGroup* vecGroup = new TestCaseGroup(m_context, "vector_subscript", "Vector subscript indexing.");
		addChild(vecGroup);

		static const DataType s_vectorTypes[] = { TYPE_FLOAT_VEC2, TYPE_FLOAT_VEC3, TYPE_FLOAT_VEC4 };

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_vectorTypes); typeNdx++)
		{
			DataType varType = s_vectorTypes[typeNdx];
			for (int isReadDirect = 0; isReadDirect < 2; isReadDirect++)
			{
				for (int access = SUBSCRIPT_STATIC; access < VECTORACCESS_LAST; access++)
				{
					VectorAccessType readAccess  = isReadDirect ? DIRECT : (VectorAccessType)access;
					VectorAccessType writeAccess = isReadDirect ? (VectorAccessType)access : DIRECT;

					const char* writeAccessName = getVectorAccessTypeName(writeAccess);
					const char* readAccessName  = getVectorAccessTypeName(readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType  shaderType	 = s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName = getShaderTypeName((ShaderType)shaderType);
						string		name = string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" +
									  readAccessName + "_read_" + shaderTypeName;
						string desc = string("Vector subscript access with ") + writeAccessName + " write and " +
									  readAccessName + " read in " + shaderTypeName + " shader.";
						bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						vecGroup->addChild(createVectorSubscriptCase(
							m_context, name.c_str(), desc.c_str(), m_glslVersion, isVertexCase, varType,
							(VectorAccessType)writeAccess, (VectorAccessType)readAccess));
					}
				}
			}
		}
	}

	// Matrix indexing with subscripts.
	{
		TestCaseGroup* matGroup = new TestCaseGroup(m_context, "matrix_subscript", "Matrix subscript indexing.");
		addChild(matGroup);

		static const DataType s_matrixTypes[] = { TYPE_FLOAT_MAT2,   TYPE_FLOAT_MAT2X3, TYPE_FLOAT_MAT2X4,
												  TYPE_FLOAT_MAT3X2, TYPE_FLOAT_MAT3,   TYPE_FLOAT_MAT3X4,
												  TYPE_FLOAT_MAT4X2, TYPE_FLOAT_MAT4X3, TYPE_FLOAT_MAT4 };

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_matrixTypes); typeNdx++)
		{
			DataType varType = s_matrixTypes[typeNdx];
			for (int isReadStatic = 0; isReadStatic < 2; isReadStatic++)
			{
				for (int access = INDEXACCESS_STATIC + 1; access < INDEXACCESS_LAST; access++)
				{
					IndexAccessType readAccess  = isReadStatic ? INDEXACCESS_STATIC : (IndexAccessType)access;
					IndexAccessType writeAccess = isReadStatic ? (IndexAccessType)access : INDEXACCESS_STATIC;

					const char* writeAccessName = getIndexAccessTypeName(writeAccess);
					const char* readAccessName  = getIndexAccessTypeName(readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType  shaderType	 = s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName = getShaderTypeName((ShaderType)shaderType);
						string		name = string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" +
									  readAccessName + "_read_" + shaderTypeName;
						string desc = string("Vector subscript access with ") + writeAccessName + " write and " +
									  readAccessName + " read in " + shaderTypeName + " shader.";
						bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						matGroup->addChild(createMatrixSubscriptCase(
							m_context, name.c_str(), desc.c_str(), m_glslVersion, isVertexCase, varType,
							(IndexAccessType)writeAccess, (IndexAccessType)readAccess));
					}
				}
			}
		}
	}
}